

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall
GEO::PeriodicDelaunay3dThread::get_lifted_vertex
          (PeriodicDelaunay3dThread *this,index_t v,double *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  uVar7 = (ulong)v;
  bVar4 = this->periodic_;
  if (bVar4 == true) {
    uVar7 = (ulong)(this->super_Periodic).nb_vertices_non_periodic_;
    uVar6 = v / uVar7;
    uVar7 = (ulong)v % uVar7;
  }
  else {
    uVar6 = 0;
  }
  pdVar5 = this->vertices_;
  dVar1 = pdVar5[(uint)((int)uVar7 * 3)];
  *result = dVar1;
  dVar2 = pdVar5[(int)uVar7 * 3 + 1];
  result[1] = dVar2;
  dVar3 = pdVar5[uVar7 * 3 + 2 & 0xffffffff];
  result[2] = dVar3;
  if (this->weights_ == (double *)0x0) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = this->weights_[uVar7];
  }
  result[3] = -dVar8;
  if (bVar4 != false) {
    *result = (double)*(int *)(Periodic::translation + uVar6 * 0xc) * this->period_ + dVar1;
    result[1] = (double)*(int *)(Periodic::translation + uVar6 * 0xc + 4) * this->period_ + dVar2;
    result[2] = (double)*(int *)(Periodic::translation + uVar6 * 0xc + 8) * this->period_ + dVar3;
  }
  result[3] = (result[2] * result[2] + result[1] * result[1] + *result * *result) - dVar8;
  return;
}

Assistant:

void get_lifted_vertex(index_t v, double* result) const {
	    index_t instance = 0;
	    if(periodic_) {
		instance = periodic_vertex_instance(v);
		v = periodic_vertex_real(v);
	    }
	    result[0] = vertices_[3*v];
	    result[1] = vertices_[3*v+1];
	    result[2] = vertices_[3*v+2];
	    result[3] = -non_periodic_weight(v);
	    if(periodic_) {
		result[0] += double(translation[instance][0]) * period_;
		result[1] += double(translation[instance][1]) * period_;
		result[2] += double(translation[instance][2]) * period_;
	    }
	    result[3] +=
		geo_sqr(result[0]) + geo_sqr(result[1]) + geo_sqr(result[2]);
	}